

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::MultiPartOutputFile::Data::~Data(Data *this)

{
  OStream *pOVar1;
  OutputPartData *this_00;
  pointer ppOVar2;
  ulong uVar3;
  
  if ((this->deleteStream == true) &&
     (pOVar1 = (this->super_OutputStreamMutex).os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
  }
  ppOVar2 = (this->parts).
            super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->parts).
      super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar2) {
    uVar3 = 0;
    do {
      this_00 = ppOVar2[uVar3];
      if (this_00 != (OutputPartData *)0x0) {
        Header::~Header(&this_00->header);
        operator_delete(this_00,0x60);
      }
      uVar3 = uVar3 + 1;
      ppOVar2 = (this->parts).
                super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->parts).
                                   super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3))
    ;
  }
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&this->_headers);
  std::
  _Rb_tree<int,_std::pair<const_int,_Imf_3_4::GenericOutputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
  ::~_Rb_tree(&(this->_outputFiles)._M_t);
  ppOVar2 = (this->parts).
            super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar2 != (pointer)0x0) {
    operator_delete(ppOVar2,(long)(this->parts).
                                  super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar2
                   );
    return;
  }
  return;
}

Assistant:

~Data ()
    {
        if (deleteStream) delete os;

        for (size_t i = 0; i < parts.size (); i++)
            delete parts[i];
    }